

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

Vec4 __thiscall tcu::getTextureBorderColorFloat(tcu *this,TextureFormat *format,Sampler *sampler)

{
  float fVar1;
  TextureChannelClass TVar2;
  TextureSwizzle *pTVar3;
  int c;
  long lVar4;
  long lVar5;
  float fVar6;
  deUint32 dVar7;
  float fVar8;
  Vec4 VVar9;
  
  TVar2 = getTextureChannelClass(format->type);
  pTVar3 = getBorderColorReadSwizzle(format->order);
  fVar6 = 0.0;
  if (TVar2 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    fVar6 = -1.0;
  }
  VVar9.m_data[1] = 0.0;
  VVar9.m_data[0] = fVar6;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar4 = 0;
  do {
    lVar5 = (long)(int)pTVar3->components[lVar4];
    if (lVar5 == 4) {
      dVar7 = 0;
    }
    else if (pTVar3->components[lVar4] == CHANNEL_ONE) {
      dVar7 = 0x3f800000;
    }
    else if (TVar2 == TEXTURECHANNELCLASS_FLOATING_POINT) {
      dVar7 = (sampler->borderColor).v.uData[lVar5];
    }
    else {
      fVar1 = (sampler->borderColor).v.fData[lVar5];
      fVar8 = 1.0;
      if (fVar1 <= 1.0) {
        fVar8 = fVar1;
      }
      dVar7 = -(uint)(fVar1 < fVar6) & (uint)fVar6 | ~-(uint)(fVar1 < fVar6) & (uint)fVar8;
    }
    *(deUint32 *)(this + lVar4 * 4) = dVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  VVar9.m_data[2] = 1.0;
  VVar9.m_data[3] = 0.0;
  return (Vec4)VVar9.m_data;
}

Assistant:

static tcu::Vec4 getTextureBorderColorFloat (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass	channelClass	= getTextureChannelClass(format.type);
	const TextureSwizzle::Channel*	channelMap		= getBorderColorReadSwizzle(format.order).components;
	const bool						isFloat			= channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT;
	const bool						isSigned		= channelClass != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;
	const float						valueMin		= (isSigned) ? (-1.0f) : (0.0f);
	const float						valueMax		= 1.0f;
	Vec4							result;

	DE_ASSERT(channelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT ||
			  channelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT ||
			  channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT);

	for (int c = 0; c < 4; c++)
	{
		const TextureSwizzle::Channel map = channelMap[c];
		if (map == TextureSwizzle::CHANNEL_ZERO)
			result[c] = 0.0f;
		else if (map == TextureSwizzle::CHANNEL_ONE)
			result[c] = 1.0f;
		else if (isFloat)
		{
			// floating point values are not clamped
			result[c] = sampler.borderColor.getAccess<float>()[(int)map];
		}
		else
		{
			// fixed point values are clamped to a representable range
			result[c] = de::clamp(sampler.borderColor.getAccess<float>()[(int)map], valueMin, valueMax);
		}
	}

	return result;
}